

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O2

void test_ws_location_response_written_fails(void)

{
  cio_http_serve_on_error_t p_Var1;
  cio_error cVar2;
  cio_http_cb_return cVar3;
  long lVar4;
  cio_http_client client;
  cio_websocket_location_handler handler;
  cio_http_server server;
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
    p_Var1 = *(cio_http_serve_on_error_t *)((long)&DAT_00109db0 + lVar4);
    cVar2 = cio_websocket_location_handler_init
                      (&handler,(char **)0x0,0,on_connect,fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)cVar2,"web socket handler initialization failed!",0x1c6,
               UNITY_DISPLAY_STYLE_INT);
    client.parser.data = &server;
    client.add_response_header = fake_add_response_header;
    client.write_response = fake_write_response;
    client.parser._23_1_ = client.parser._23_1_ | 0x80;
    fake_write_response_fake.custom_fake = write_response_call_callback_with_error;
    client.http_method = CIO_HTTP_GET;
    client.http_major = 1;
    client.http_minor = 1;
    client.current_handler = &handler.http_location;
    handler.websocket.ws_private.http_client = &client;
    server.on_error = p_Var1;
    cVar3 = (*handler.http_location.on_header_field_name)(&client,"Sec-WebSocket-Version",0x15);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_version_field",0x1dc,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_value)
                      (handler.websocket.ws_private.http_client,"13",2);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_value returned wrong value for sec_ws_version_value",0x1de,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_name)
                      (handler.websocket.ws_private.http_client,"Sec-WebSocket-Key",0x11);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_key_field",0x1e3,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_value)
                      (handler.websocket.ws_private.http_client,"dGhlIHNhbXBsZSBub25jZQ==",0x18);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_value returned wrong value for sec_ws_key_value",0x1e5,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_headers_complete)(handler.websocket.ws_private.http_client);
    UnityAssertEqualNumber
              (1,(long)cVar3,"on_header_complete returned wrong value",0x1e8,UNITY_DISPLAY_STYLE_INT
              );
    if (p_Var1 != (cio_http_serve_on_error_t)0x0) {
      UnityAssertEqualNumber
                (1,(ulong)on_error_fake.call_count,"on_error was not called",0x1ea,
                 UNITY_DISPLAY_STYLE_INT);
    }
  }
  return;
}

Assistant:

static void test_ws_location_response_written_fails(void)
{
	struct test {
		cio_http_serve_on_error_t on_error;
	};

	struct test tests[] = {
	    {.on_error = NULL},
	    {.on_error = on_error},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct test test = tests[i];

		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, NULL, 0, on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_server server;
		server.on_error = test.on_error;

		struct cio_http_client client;
		client.parser.data = &server;
		fake_write_response_fake.custom_fake = write_response_call_callback_with_error;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = 1;
		handler.websocket.ws_private.http_client->http_minor = 1;

		static const char sec_ws_version_field[] = "Sec-WebSocket-Version";
		static const char sec_ws_version_value[] = "13";
		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_version_field, sizeof(sec_ws_version_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_version_value, sizeof(sec_ws_version_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		static const char sec_ws_key_field[] = "Sec-WebSocket-Key";
		static const char sec_ws_key_value[] = "dGhlIHNhbXBsZSBub25jZQ==";
		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_key_field, sizeof(sec_ws_key_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_key_value, sizeof(sec_ws_key_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SKIP_BODY, cb_ret, "on_header_complete returned wrong value");
		if (test.on_error != NULL) {
			TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "on_error was not called");
		}
	}
}